

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

uint ZSTDMT_computeTargetJobLog(ZSTD_CCtx_params *params)

{
  uint uVar1;
  uint uVar2;
  
  if ((params->ldmParams).enableLdm == ZSTD_ps_enable) {
    uVar2 = (params->cParams).chainLog + (uint)((params->cParams).strategy < ZSTD_btlazy2) + 2;
    if (0x14 < uVar2) {
LAB_0016a2a2:
      uVar1 = 0x1e;
      if (uVar2 < 0x1e) {
        uVar1 = uVar2;
      }
      return uVar1;
    }
    uVar2 = 0x15;
  }
  else {
    uVar2 = (params->cParams).windowLog + 2;
    if (0x13 < uVar2) goto LAB_0016a2a2;
    uVar2 = 0x14;
  }
  return uVar2;
}

Assistant:

static unsigned ZSTDMT_computeTargetJobLog(const ZSTD_CCtx_params* params)
{
    unsigned jobLog;
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on cycleLog instead. */
        jobLog = MAX(21, ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy) + 3);
    } else {
        jobLog = MAX(20, params->cParams.windowLog + 2);
    }
    return MIN(jobLog, (unsigned)ZSTDMT_JOBLOG_MAX);
}